

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

result<int,_toml::detail::none_t> toml::detail::from_string<int>(string *str)

{
  byte bVar1;
  success<int> s;
  string *in_RSI;
  result<int,_toml::detail::none_t> in_RDI;
  istringstream iss;
  int v;
  int *in_stack_fffffffffffffe28;
  istringstream local_198 [388];
  int local_14 [5];
  
  std::__cxx11::istringstream::istringstream(local_198,in_RSI,_S_in);
  std::istream::operator>>(local_198,local_14);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    s = ok<int&>(in_stack_fffffffffffffe28);
    result<int,_toml::detail::none_t>::result
              ((result<int,_toml::detail::none_t> *)in_RDI,(success_type)s.value);
  }
  else {
    toml::err();
    result<int,_toml::detail::none_t>::result((result<int,_toml::detail::none_t> *)in_RDI);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return in_RDI;
}

Assistant:

result<T, none_t> from_string(const std::string& str)
{
    T v;
    std::istringstream iss(str);
    iss >> v;
    if(iss.fail())
    {
        return err();
    }
    return ok(v);
}